

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cont.c
# Opt level: O0

void model_init(model *m)

{
  ggml_context *pgVar1;
  ggml_backend_t pgVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 *in_RDI;
  ggml_init_params params0;
  size_t buf_size;
  
  pgVar1 = make_ctx();
  *in_RDI = pgVar1;
  pgVar2 = make_backend();
  in_RDI[2] = pgVar2;
  lVar3 = ggml_tensor_overhead();
  lVar4 = ggml_graph_overhead();
  pvVar5 = calloc(lVar3 * 0x800 + lVar4,1);
  in_RDI[6] = pvVar5;
  uVar6 = ggml_init();
  in_RDI[1] = uVar6;
  uVar6 = ggml_new_graph(in_RDI[1]);
  in_RDI[4] = uVar6;
  return;
}

Assistant:

void model_init(struct model* m) {
    m->ctx = make_ctx();
    m->backend = make_backend();

    size_t buf_size = ggml_tensor_overhead() * GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead();
    m->buf = calloc(buf_size, sizeof(uint8_t));
    struct ggml_init_params params0 = {
        .mem_size = buf_size,
        .mem_buffer = m->buf,
        .no_alloc = true,
    };
    m->ctx0 = ggml_init(params0);
    m->gf = ggml_new_graph(m->ctx0);
}